

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.cc
# Opt level: O3

size_t webrtc::WriteFloatBufferToFile(FileWrapper *file,size_t length,float *buffer)

{
  uint32_t binary_value;
  int iVar1;
  float fVar2;
  void *pvVar3;
  size_t i;
  long lVar4;
  size_t sVar5;
  
  if (file == (FileWrapper *)0x0) {
    sVar5 = 0;
  }
  else {
    iVar1 = (*(file->super_InStream)._vptr_InStream[4])();
    sVar5 = 0;
    if (((length != 0) && (buffer != (float *)0x0)) && ((char)iVar1 != '\0')) {
      pvVar3 = operator_new__(4);
      sVar5 = 0;
      do {
        fVar2 = buffer[sVar5];
        lVar4 = 0;
        do {
          *(char *)((long)pvVar3 + lVar4) = SUB41(fVar2,0);
          fVar2 = (float)((uint)fVar2 >> 8);
          lVar4 = lVar4 + 1;
        } while (lVar4 != 4);
        (**(file->super_OutStream)._vptr_OutStream)(&file->super_OutStream,pvVar3,4);
        sVar5 = sVar5 + 1;
      } while (sVar5 != length);
      (*(file->super_InStream)._vptr_InStream[9])(file);
      operator_delete__(pvVar3);
      sVar5 = length;
    }
  }
  return sVar5;
}

Assistant:

size_t WriteFloatBufferToFile(FileWrapper* file,
                              size_t length,
                              const float* buffer) {
  if (!file || !file->Open() || !buffer || length <= 0) {
    return 0;
  }

  std::unique_ptr<uint8_t[]> byte_array(new uint8_t[4]);

  size_t floats_written = 0;

  for (floats_written = 0; floats_written < length; ++floats_written) {
    // Get byte representation.
    ConvertFloatToByteArray(buffer[floats_written], byte_array.get());

    file->Write(byte_array.get(), 4);
  }

  file->Flush();

  return floats_written;
}